

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAuxSourceDirectoryCommand.cxx
# Opt level: O2

bool cmAuxSourceDirectoryCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *in_name;
  bool bVar1;
  long lVar2;
  string *a;
  Status SVar3;
  unsigned_long uVar4;
  char *__s;
  long lVar5;
  cmake *pcVar6;
  cmSourceFile *this;
  unsigned_long dindex;
  string_view value;
  basic_string_view<char,_std::char_traits<char>_> ext;
  allocator<char> local_142;
  allocator<char> local_141;
  cmMakefile *local_140;
  Directory dir;
  string sourceListValue;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string tdir;
  string fullname;
  string local_70;
  undefined1 local_50 [32];
  
  in_name = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)in_name;
  if (lVar2 == 0x40) {
    local_140 = status->Makefile;
    sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
    sourceListValue._M_string_length = 0;
    sourceListValue.field_2._M_local_buf[0] = '\0';
    tdir._M_dataplus._M_p = (pointer)&tdir.field_2;
    tdir._M_string_length = 0;
    tdir.field_2._M_local_buf[0] = '\0';
    bVar1 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&tdir);
    }
    else {
      a = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_140);
      fullname._M_dataplus._M_p._0_1_ = 0x2f;
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                (&file,a,(char *)&fullname,in_name);
      std::__cxx11::string::operator=((string *)&tdir,(string *)&file);
      std::__cxx11::string::~string((string *)&file);
    }
    cmMakefile::GetSafeDefinition
              (local_140,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::_M_assign((string *)&sourceListValue);
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmsys::Directory::Directory(&dir);
    SVar3 = cmsys::Directory::Load(&dir,&tdir,(string *)0x0);
    if (SVar3.Kind_ == Success) {
      uVar4 = cmsys::Directory::GetNumberOfFiles(&dir);
      for (dindex = 0; uVar4 != dindex; dindex = dindex + 1) {
        __s = cmsys::Directory::GetFile(&dir,dindex);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&file,__s,(allocator<char> *)&fullname);
        lVar5 = std::__cxx11::string::rfind((char)&file,0x2e);
        if (lVar5 != -1) {
          fullname._M_dataplus._M_p = (pointer)file._M_string_length;
          fullname._M_string_length = (size_type)file._M_dataplus._M_p;
          ext = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)&fullname,lVar5 + 1,
                           0xffffffffffffffff);
          pcVar6 = cmMakefile::GetCMakeInstance(local_140);
          if (lVar5 != 0) {
            bVar1 = cmake::FileExtensions::Test(&pcVar6->CLikeSourceFileExtensions,ext);
            if (bVar1) {
              local_70._M_dataplus._M_p._0_1_ = 0x2f;
              cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
                        (&fullname,in_name,(char *)&local_70,&file);
              this = cmMakefile::GetOrCreateSource(local_140,&fullname,false,Ambiguous);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,"ABSTRACT",&local_141);
              std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"0",&local_142);
              cmSourceFile::SetProperty(this,&local_70,(string *)local_50);
              std::__cxx11::string::~string((string *)local_50);
              std::__cxx11::string::~string((string *)&local_70);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&files
                         ,&fullname);
              std::__cxx11::string::~string((string *)&fullname);
            }
          }
        }
        std::__cxx11::string::~string((string *)&file);
      }
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    if (sourceListValue._M_string_length != 0) {
      std::__cxx11::string::append((char *)&sourceListValue);
    }
    cmList::
    to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              (&file,&files);
    std::__cxx11::string::append((string *)&sourceListValue);
    std::__cxx11::string::~string((string *)&file);
    value._M_str = sourceListValue._M_dataplus._M_p;
    value._M_len = sourceListValue._M_string_length;
    cmMakefile::AddDefinition
              (local_140,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,value);
    cmsys::Directory::~Directory(&dir);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&files);
    std::__cxx11::string::~string((string *)&tdir);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sourceListValue,"called with incorrect number of arguments",
               (allocator<char> *)&tdir);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  std::__cxx11::string::~string((string *)&sourceListValue);
  return lVar2 == 0x40;
}

Assistant:

bool cmAuxSourceDirectoryCommand(std::vector<std::string> const& args,
                                 cmExecutionStatus& status)
{
  if (args.size() != 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  std::string sourceListValue;
  std::string const& templateDirectory = args[0];
  std::string tdir;
  if (!cmSystemTools::FileIsFullPath(templateDirectory)) {
    tdir = cmStrCat(mf.GetCurrentSourceDirectory(), '/', templateDirectory);
  } else {
    tdir = templateDirectory;
  }

  // was the list already populated
  sourceListValue = mf.GetSafeDefinition(args[1]);

  std::vector<std::string> files;

  // Load all the files in the directory
  cmsys::Directory dir;
  if (dir.Load(tdir)) {
    size_t numfiles = dir.GetNumberOfFiles();
    for (size_t i = 0; i < numfiles; ++i) {
      std::string file = dir.GetFile(static_cast<unsigned long>(i));
      // Split the filename into base and extension
      std::string::size_type dotpos = file.rfind('.');
      if (dotpos != std::string::npos) {
        auto ext = cm::string_view(file).substr(dotpos + 1);
        // Process only source files
        auto* cm = mf.GetCMakeInstance();
        if (dotpos > 0 && cm->IsACLikeSourceExtension(ext)) {
          std::string fullname = cmStrCat(templateDirectory, '/', file);
          // add the file as a class file so
          // depends can be done
          cmSourceFile* sf = mf.GetOrCreateSource(fullname);
          sf->SetProperty("ABSTRACT", "0");
          files.push_back(std::move(fullname));
        }
      }
    }
  }
  std::sort(files.begin(), files.end());
  if (!sourceListValue.empty()) {
    sourceListValue += ";";
  }
  sourceListValue += cmList::to_string(files);
  mf.AddDefinition(args[1], sourceListValue);
  return true;
}